

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O3

void __thiscall soul::HEARTGenerator::visit(HEARTGenerator *this,Graph *g)

{
  vector<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_> *__x;
  Module *pMVar1;
  unique_ptr<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
  __p;
  Annotation local_58;
  
  AST::Annotation::toPlainAnnotation
            (&local_58,&(g->super_ProcessorBase).annotation,
             &((this->module->program).pimpl)->stringDictionary);
  __p._M_t.
  super___uniq_ptr_impl<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_*,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
  .
  super__Head_base<0UL,_std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_*,_false>
  ._M_head_impl =
       local_58.properties._M_t.
       super___uniq_ptr_impl<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_*,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
       .
       super__Head_base<0UL,_std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_*,_false>
       ._M_head_impl;
  pMVar1 = this->module;
  local_58.properties._M_t.
  super___uniq_ptr_impl<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_*,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
  .
  super__Head_base<0UL,_std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
          )0x0;
  std::
  __uniq_ptr_impl<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
  ::reset((__uniq_ptr_impl<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
           *)&pMVar1->annotation,
          (pointer)__p._M_t.
                   super___uniq_ptr_impl<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_*,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
                   .
                   super__Head_base<0UL,_std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_*,_false>
                   ._M_head_impl);
  __x = &local_58.dictionary.strings;
  std::vector<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_>::
  operator=(&(pMVar1->annotation).dictionary.strings,__x);
  (pMVar1->annotation).dictionary.nextIndex = local_58.dictionary.nextIndex;
  local_58.dictionary.super_StringDictionary._vptr_StringDictionary =
       (_func_int **)&PTR__StringDictionary_002ca250;
  std::vector<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_>::~vector
            (__x);
  std::
  unique_ptr<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
  ::~unique_ptr(&local_58.properties);
  (this->sourceGraph).object = g;
  this->parsingStateVariables = true;
  ASTVisitor::visit(&this->super_ASTVisitor,g);
  this->parsingStateVariables = false;
  return;
}

Assistant:

void visit (AST::Graph& g) override
    {
        module.annotation = g.annotation.toPlainAnnotation (module.program.getStringDictionary());
        sourceGraph = g;

        parsingStateVariables = true;
        super::visit (g);
        parsingStateVariables = false;
    }